

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O1

void inclinenumber(LexState *ls)

{
  size_t sVar1;
  ZIO *pZVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  uVar5 = ls->current;
  pZVar2 = ls->z;
  sVar1 = pZVar2->n;
  pZVar2->n = pZVar2->n - 1;
  if (sVar1 == 0) {
    uVar4 = luaZ_fill(pZVar2);
  }
  else {
    pbVar3 = (byte *)pZVar2->p;
    pZVar2->p = (char *)(pbVar3 + 1);
    uVar4 = (uint)*pbVar3;
  }
  ls->current = uVar4;
  if (((uVar4 == 0xd) || (uVar4 == 10)) && (uVar4 != uVar5)) {
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
  }
  iVar6 = ls->linenumber + 1;
  ls->linenumber = iVar6;
  if (iVar6 != 0x7fffffff) {
    return;
  }
  lexerror(ls,"chunk has too many lines",0);
}

Assistant:

static void inclinenumber (LexState *ls) {
  int old = ls->current;
  lua_assert(currIsNewline(ls));
  next(ls);  /* skip '\n' or '\r' */
  if (currIsNewline(ls) && ls->current != old)
    next(ls);  /* skip '\n\r' or '\r\n' */
  if (++ls->linenumber >= MAX_INT)
    lexerror(ls, "chunk has too many lines", 0);
}